

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O1

void CtermCheck(chainEndData_t *ed,int rescnt,int isChainEnd)

{
  byte *pbVar1;
  atom *paVar2;
  long lVar3;
  
  if (rescnt == 0 || isChainEnd == 0) {
    return;
  }
  ed->last = rescnt;
  lVar3 = 0;
  do {
    paVar2 = ed->ambigN[lVar3];
    if (paVar2 == (atom *)0x0) break;
    if ((paVar2->r->rescnt == ed->first) && (ed->Ntmarkers == ed->first)) {
      pbVar1 = (byte *)((long)&paVar2->props + 2);
      *pbVar1 = *pbVar1 | 0x40;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  lVar3 = 8;
  do {
    paVar2 = ed->ambigN[lVar3];
    if (paVar2 == (atom *)0x0) break;
    if ((paVar2->r->rescnt == rescnt) && (ed->Ctmarkers == rescnt)) {
      pbVar1 = (byte *)((long)&paVar2->props + 2);
      *pbVar1 = *pbVar1 | 0x20;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  memset(ed,0,0xa4);
  return;
}

Assistant:

void CtermCheck(chainEndData_t *ed, int rescnt, int isChainEnd)
{
   int i = 0;
   /* avoid processing the first time 'cause there ain't no chain pending */

   if (isChainEnd && rescnt) {
      ed->last = rescnt; /* last residue */

      /* see if we can put the pieces together to determine end charge */

      for (i = 0; i < 4; i++) { /* only array[0-3] contains first Ns */
	 if (ed->ambigN[i]) {
	    if (ed->ambigN[i]->r->rescnt == ed->first
	    &&  ed->Ntmarkers         == ed->first) {
	       ed->ambigN[i]->props |= POSITIVE_PROP;
	    }
	 }
	 else { break; }
      }
      for (i = 0; i < 8; i++) { /* array[0-7] contains last Os */
	 if (ed->ambigO[i]) {
	    if (ed->ambigO[i]->r->rescnt == ed->last
	    &&  ed->Ctmarkers         == ed->last) {
	       ed->ambigO[i]->props |= NEGATIVE_PROP;
	    }
	 }
	 else { break; }
      }

      initEndData(ed); /* reset the end data record */
   }
}